

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void kratos::mock_hierarchy(Generator *top,string *top_name)

{
  pointer pcVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  Generator *this;
  InternalException *this_00;
  string *name_00;
  pointer *ppbVar5;
  long lVar6;
  long lVar7;
  undefined1 local_c8 [8];
  string instance_name;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  Context *local_38;
  
  local_c8 = (undefined1  [8])&instance_name._M_string_length;
  pcVar1 = (top->instance_name)._M_dataplus._M_p;
  local_40 = top_name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar1,pcVar1 + (top->instance_name)._M_string_length);
  lVar4 = std::__cxx11::string::find((char)(string *)local_c8,0x2e);
  if (lVar4 != -1) {
    names.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,".","");
    string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&name.field_2 + 8),(string *)local_c8,
                       (string *)
                       &names.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage != &local_60) {
      operator_delete(names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (ulong)(local_60._M_dataplus._M_p + 1));
    }
    if ((ulong)((long)names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - name.field_2._8_8_) < 0x21) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"Cannot tokenize string ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8);
      InternalException::InternalException
                (this_00,(string *)
                         &names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_38 = top->context_;
    std::__cxx11::string::_M_assign((string *)&top->instance_name);
    uVar3 = (int)((ulong)((long)names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - name.field_2._8_8_) >> 5
                 ) - 2;
    if (-1 < (int)uVar3) {
      lVar6 = (ulong)uVar3 << 5;
      lVar4 = (ulong)uVar3 + 1;
      do {
        name_00 = (string *)(&instance_name.field_2._M_allocated_capacity + 1);
        instance_name.field_2._8_8_ = &name._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)name_00,*(long *)(name.field_2._8_8_ + lVar6),
                   *(long *)(name.field_2._8_8_ + 8 + lVar6) + *(long *)(name.field_2._8_8_ + lVar6)
                  );
        if ((lVar6 == 0) && (local_40->_M_string_length != 0)) {
          std::__cxx11::string::_M_assign((string *)name_00);
        }
        bVar2 = Context::generator_name_exists(local_38,name_00);
        if (bVar2) {
          ppbVar5 = &names.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
          Context::get_generators_by_name
                    ((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                      *)ppbVar5,local_38,name_00);
          this = *(Generator **)(local_60._M_string_length + 0x20);
          std::
          _Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
          ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                       *)ppbVar5);
        }
        else {
          this = Context::generator(local_38,name_00);
        }
        ppbVar5 = &names.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<kratos::Generator,void>
                  ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)ppbVar5,
                   (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                   &top->super_enable_shared_from_this<kratos::Generator>);
        Generator::add_child_generator
                  (this,&top->instance_name,(shared_ptr<kratos::Generator> *)ppbVar5);
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
        }
        if ((size_type *)instance_name.field_2._8_8_ != &name._M_string_length) {
          operator_delete((void *)instance_name.field_2._8_8_,name._M_string_length + 1);
        }
        lVar6 = lVar6 + -0x20;
        lVar7 = lVar4 + -1;
        bVar2 = 0 < lVar4;
        top = this;
        lVar4 = lVar7;
      } while (lVar7 != 0 && bVar2);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&name.field_2 + 8));
  }
  if (local_c8 != (undefined1  [8])&instance_name._M_string_length) {
    operator_delete((void *)local_c8,instance_name._M_string_length + 1);
  }
  return;
}

Assistant:

void mock_hierarchy(Generator *top, const std::string &top_name) {
    // can only perform on the top layer
    auto instance_name = top->instance_name;
    if (instance_name.find('.') == std::string::npos) {
        return;
    }
    // need to tokenize based on the instance names
    auto names = string::get_tokens(instance_name, ".");
    if (names.size() < 2) throw InternalException("Cannot tokenize string " + instance_name);
    Context *context = top->context();
    top->instance_name = names.back();
    int start_index = static_cast<int>(names.size() - 2);
    Generator *pre = top;
    for (int i = start_index; i >= 0; i--) {
        // create a new generator
        std::string name = names[i];
        if (i == 0 && !top_name.empty()) name = top_name;
        Generator *gen;
        if (context->generator_name_exists(name)) {
            gen = (*(context->get_generators_by_name(name).begin())).get();
        } else {
            gen = &context->generator(name);
        }
        gen->add_child_generator(pre->instance_name, pre->shared_from_this());
        pre = gen;
    }
}